

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_chain_pdf2
          (Impl *this,void *pNext,ScratchAllocator *alloc,void **out_pnext)

{
  VkStructureType VVar1;
  bool bVar2;
  VkPhysicalDeviceMeshShaderFeaturesEXT *create_info;
  void *pvVar3;
  void **ppvVar4;
  VkPhysicalDeviceRobustness2FeaturesEXT *ci;
  long *in_FS_OFFSET;
  void *local_38;
  
  ppvVar4 = &local_38;
  local_38 = (void *)0x0;
  do {
    create_info = (VkPhysicalDeviceMeshShaderFeaturesEXT *)
                  pnext_chain_pdf2_skip_ignored_entries(pNext);
    if (create_info == (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0) {
      *out_pnext = local_38;
LAB_00118831:
      return create_info == (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
    }
    VVar1 = create_info->sType;
    if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV) {
      pvVar3 = copy_pnext_struct_simple<VkPhysicalDeviceMeshShaderFeaturesNV>
                         (this,(VkPhysicalDeviceMeshShaderFeaturesNV *)create_info,alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR) {
      pvVar3 = copy_pnext_struct_simple<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>
                         (this,(VkPhysicalDeviceFragmentShadingRateFeaturesKHR *)create_info,alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT) {
      pvVar3 = copy_pnext_struct_simple<VkPhysicalDeviceShaderObjectFeaturesEXT>
                         (this,(VkPhysicalDeviceShaderObjectFeaturesEXT *)create_info,alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT) {
      pvVar3 = copy_pnext_struct_simple<VkPhysicalDeviceDescriptorBufferFeaturesEXT>
                         (this,(VkPhysicalDeviceDescriptorBufferFeaturesEXT *)create_info,alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV) {
      pvVar3 = copy_pnext_struct_simple<VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV>
                         (this,(VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *)create_info,
                          alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT) {
      pvVar3 = copy_pnext_struct_simple<VkPhysicalDeviceMeshShaderFeaturesEXT>
                         (this,create_info,alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES) {
      pvVar3 = copy_pnext_struct_simple<VkPhysicalDeviceImageRobustnessFeatures>
                         (this,(VkPhysicalDeviceImageRobustnessFeatures *)create_info,alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT) {
      pvVar3 = copy_pnext_struct_simple<VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT>
                         (this,(VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *)create_info,
                          alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT) {
      pvVar3 = copy_pnext_struct_simple<VkPhysicalDeviceImage2DViewOf3DFeaturesEXT>
                         (this,(VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *)create_info,alloc);
    }
    else {
      if (VVar1 != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT) {
        if (*(int *)(*in_FS_OFFSET + -0x18) < 3) {
          bVar2 = Internal::log_thread_callback
                            (LOG_ERROR,"Cannot copy unknown pNext sType: %d.\n",(ulong)VVar1);
          if (!bVar2) {
            fprintf(_stderr,"Fossilize ERROR: Cannot copy unknown pNext sType: %d.\n",
                    (ulong)create_info->sType);
          }
        }
        goto LAB_00118831;
      }
      pvVar3 = copy_pnext_struct_simple<VkPhysicalDeviceRobustness2FeaturesEXT>
                         (this,(VkPhysicalDeviceRobustness2FeaturesEXT *)create_info,alloc);
    }
    *ppvVar4 = pvVar3;
    pNext = create_info->pNext;
    *(undefined8 *)((long)pvVar3 + 8) = 0;
    ppvVar4 = (void **)((long)pvVar3 + 8);
  } while( true );
}

Assistant:

bool StateRecorder::Impl::copy_pnext_chain_pdf2(const void *pNext, ScratchAllocator &alloc, void **out_pnext)
{
	VkBaseInStructure new_pnext = {};
	const VkBaseInStructure **ppNext = &new_pnext.pNext;

	while ((pNext = pnext_chain_pdf2_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceRobustness2FeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceImageRobustnessFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV:
		{
			auto *ci = static_cast<const VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR:
		{
			auto *ci = static_cast<const VkPhysicalDeviceFragmentShadingRateFeaturesKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV:
		{
			auto *ci = static_cast<const VkPhysicalDeviceMeshShaderFeaturesNV *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceMeshShaderFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceDescriptorBufferFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceShaderObjectFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		default:
			LOGE_LEVEL("Cannot copy unknown pNext sType: %d.\n", int(pin->sType));
			return false;
		}

		pNext = pin->pNext;
		ppNext = const_cast<const VkBaseInStructure **>(&(*ppNext)->pNext);
		*ppNext = nullptr;
	}

	*out_pnext = (void *)new_pnext.pNext;
	return true;
}